

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_iCCP(png_structrp png_ptr,png_const_charp name,png_const_bytep profile)

{
  png_uint_32 pVar1;
  int iVar2;
  uint uVar3;
  char *error_message;
  uint prefix_len;
  png_byte new_name [81];
  compression_state comp;
  png_byte apStack_498 [96];
  compression_state local_438;
  
  if (profile == (png_const_bytep)0x0) {
    error_message = "No profile for iCCP chunk";
  }
  else {
    uVar3 = (uint)profile[2] << 8 | (uint)profile[1] << 0x10 | (uint)*profile << 0x18 |
            (uint)profile[3];
    if (uVar3 < 0x84) {
      error_message = "ICC profile too short";
    }
    else if (((profile[3] & 3) == 0) || (profile[8] < 4)) {
      pVar1 = png_check_keyword(png_ptr,name,apStack_498);
      if (pVar1 == 0) {
        error_message = "iCCP: invalid keyword";
      }
      else {
        apStack_498[pVar1 + 1] = '\0';
        prefix_len = pVar1 + 2;
        local_438.input_len = (png_alloc_size_t)uVar3;
        local_438.output_len = 0;
        local_438.input = profile;
        iVar2 = png_text_compress(png_ptr,0x69434350,&local_438,prefix_len);
        if (iVar2 == 0) {
          png_write_chunk_header(png_ptr,0x69434350,local_438.output_len + prefix_len);
          png_write_chunk_data(png_ptr,apStack_498,(ulong)prefix_len);
          png_write_compressed_data_out(png_ptr,&local_438);
          png_write_chunk_end(png_ptr);
          return;
        }
        error_message = (png_ptr->zstream).msg;
      }
    }
    else {
      error_message = "ICC profile length invalid (not a multiple of 4)";
    }
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_write_iCCP(png_structrp png_ptr, png_const_charp name,
    png_const_bytep profile)
{
   png_uint_32 name_len;
   png_uint_32 profile_len;
   png_byte new_name[81]; /* 1 byte for the compression byte */
   compression_state comp;
   png_uint_32 temp;

   png_debug(1, "in png_write_iCCP");

   /* These are all internal problems: the profile should have been checked
    * before when it was stored.
    */
   if (profile == NULL)
      png_error(png_ptr, "No profile for iCCP chunk"); /* internal error */

   profile_len = png_get_uint_32(profile);

   if (profile_len < 132)
      png_error(png_ptr, "ICC profile too short");

   temp = (png_uint_32) (*(profile+8));
   if (temp > 3 && (profile_len & 0x03))
      png_error(png_ptr, "ICC profile length invalid (not a multiple of 4)");

   {
      png_uint_32 embedded_profile_len = png_get_uint_32(profile);

      if (profile_len != embedded_profile_len)
         png_error(png_ptr, "Profile length does not match profile");
   }

   name_len = png_check_keyword(png_ptr, name, new_name);

   if (name_len == 0)
      png_error(png_ptr, "iCCP: invalid keyword");

   new_name[++name_len] = PNG_COMPRESSION_TYPE_BASE;

   /* Make sure we include the NULL after the name and the compression type */
   ++name_len;

   png_text_compress_init(&comp, profile, profile_len);

   /* Allow for keyword terminator and compression byte */
   if (png_text_compress(png_ptr, png_iCCP, &comp, name_len) != Z_OK)
      png_error(png_ptr, png_ptr->zstream.msg);

   png_write_chunk_header(png_ptr, png_iCCP, name_len + comp.output_len);

   png_write_chunk_data(png_ptr, new_name, name_len);

   png_write_compressed_data_out(png_ptr, &comp);

   png_write_chunk_end(png_ptr);
}